

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsReadDeclaration(Wlc_Prs_t *p,char *pStart)

{
  Wlc_Ntk_t *p_00;
  int Beg_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int Id;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  Wlc_Obj_t *pWVar7;
  bool bVar8;
  int End;
  int Beg;
  int Signed;
  int fFound;
  int local_40;
  int XValue;
  char *pName;
  
  fFound = 0;
  Signed = 0;
  Beg = 0;
  End = 0;
  iVar1 = Wlc_PrsStrCmp(pStart,"input");
  if (iVar1 == 0) {
    iVar2 = Wlc_PrsStrCmp(pStart,"output");
    iVar1 = 0;
    bVar8 = iVar2 == 0;
    lVar4 = 6;
    if (bVar8) {
      lVar4 = 0;
    }
  }
  else {
    bVar8 = true;
    iVar1 = 1;
    lVar4 = 5;
  }
  pcVar5 = Wlc_PrsSkipSpaces(pStart + lVar4);
  iVar2 = Wlc_PrsStrCmp(pcVar5,"wire");
  if (iVar2 == 0) {
    iVar2 = Wlc_PrsStrCmp(pcVar5,"reg");
    lVar4 = (ulong)(iVar2 != 0) * 3;
  }
  else {
    lVar4 = 4;
  }
  pcVar5 = Wlc_PrsFindWord(pcVar5 + lVar4,"signed",&Signed);
  pcVar6 = Wlc_PrsFindRange(pcVar5,&End,&Beg);
  Beg_00 = Beg;
  iVar2 = End;
  if (pcVar6 == (char *)0x0) {
    Wlc_PrsWriteErrorMessage(p,pcVar5,"Non-standard range.");
  }
  else {
    if ((Beg != 0 && End != 0) && (iVar3 = p->nNonZero[0], p->nNonZero[0] = iVar3 + 1, iVar3 == 0))
    {
      p->nNonZero[1] = End;
      p->nNonZero[2] = Beg;
      iVar3 = Wlc_PrsFindLine(p,pcVar6);
      p->nNonZero[3] = iVar3;
    }
    if (((iVar2 | Beg_00) < 0) && (iVar3 = p->nNegative[0], p->nNegative[0] = iVar3 + 1, iVar3 == 0)
       ) {
      p->nNegative[1] = iVar2;
      p->nNegative[2] = Beg_00;
      iVar3 = Wlc_PrsFindLine(p,pcVar6);
      p->nNegative[3] = iVar3;
    }
    if ((iVar2 < Beg_00) && (iVar3 = p->nReverse[0], p->nReverse[0] = iVar3 + 1, iVar3 == 0)) {
      p->nReverse[1] = iVar2;
      p->nReverse[2] = Beg_00;
      iVar3 = Wlc_PrsFindLine(p,pcVar6);
      p->nReverse[3] = iVar3;
    }
    local_40 = Signed;
    while (pcVar6 = Wlc_PrsFindName(pcVar6,&pName), pcVar5 = pName, pcVar6 != (char *)0x0) {
      iVar3 = Abc_NamStrFindOrAdd(p->pNtk->pManName,pName,&fFound);
      if (fFound != 0) {
        Wlc_PrsWriteErrorMessage(p,pcVar6,"Name %s is declared more than once.",pcVar5);
        return 0;
      }
      Id = Wlc_ObjAlloc(p->pNtk,iVar1,local_40,iVar2,Beg_00);
      if (!bVar8) {
        p_00 = p->pNtk;
        pWVar7 = Wlc_NtkObj(p_00,Id);
        Wlc_ObjSetCo(p_00,pWVar7,0);
      }
      if (Id != iVar3) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                      ,0x3a5,"int Wlc_PrsReadDeclaration(Wlc_Prs_t *, char *)");
      }
      pcVar6 = Wlc_PrsSkipSpaces(pcVar6);
      if (*pcVar6 != ',') {
        iVar1 = Wlc_PrsFindDefinition(p,pcVar6,p->vFanins,&XValue);
        if (iVar1 != 0) {
          pWVar7 = Wlc_NtkObj(p->pNtk,iVar3);
          Wlc_ObjUpdateType(p->pNtk,pWVar7,iVar1);
          Wlc_ObjAddFanins(p->pNtk,pWVar7,p->vFanins);
          *(ushort *)pWVar7 =
               (ushort)*(undefined4 *)pWVar7 & 0xf7ff | (ushort)((XValue & 1U) << 0xb);
        }
        return 1;
      }
      pcVar6 = pcVar6 + 1;
    }
    Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in declaration.");
  }
  return 0;
}

Assistant:

int Wlc_PrsReadDeclaration( Wlc_Prs_t * p, char * pStart )
{
    int fFound = 0, Type = WLC_OBJ_NONE, iObj; char * pLine;
    int Signed = 0, Beg = 0, End = 0, NameId, fIsPo = 0;
    if ( Wlc_PrsStrCmp( pStart, "input" ) )
        pStart += strlen("input"), Type = WLC_OBJ_PI;
    else if ( Wlc_PrsStrCmp( pStart, "output" ) )
        pStart += strlen("output"), fIsPo = 1;
    pStart = Wlc_PrsSkipSpaces( pStart );
    if ( Wlc_PrsStrCmp( pStart, "wire" ) )
        pStart += strlen("wire");
    else if ( Wlc_PrsStrCmp( pStart, "reg" ) )
        pStart += strlen("reg");
    // read 'signed'
    pStart = Wlc_PrsFindWord( pStart, "signed", &Signed );
    // read range
    pLine = pStart;
    pStart = Wlc_PrsFindRange( pStart, &End, &Beg );
    if ( pStart == NULL )
        return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
    if ( End != 0 && Beg != 0 )
    {
        if ( p->nNonZero[0]++ == 0 )
        {
            p->nNonZero[1] = End;
            p->nNonZero[2] = Beg;
            p->nNonZero[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < 0 || Beg < 0  )
    {
        if ( p->nNegative[0]++ == 0 )
        {
            p->nNegative[1] = End;
            p->nNegative[2] = Beg;
            p->nNegative[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < Beg )
    {
        if ( p->nReverse[0]++ == 0 )
        {
            p->nReverse[1] = End;
            p->nReverse[2] = Beg;
            p->nReverse[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    while ( 1 )
    {
        char * pName; int XValue, TypeNew;
        // read name
        pStart = Wlc_PrsFindName( pStart, &pName );
        if ( pStart == NULL )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Cannot read name in declaration." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( fFound )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Name %s is declared more than once.", pName );
        iObj = Wlc_ObjAlloc( p->pNtk, Type, Signed, End, Beg );
        if ( fIsPo ) Wlc_ObjSetCo( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), 0 );
        assert( iObj == NameId );
        // check next definition
        pStart = Wlc_PrsSkipSpaces( pStart );
        if ( pStart[0] == ',' )
        {
            pStart++;
            continue;
        }
        // check definition
        TypeNew = Wlc_PrsFindDefinition( p, pStart, p->vFanins, &XValue );
        if ( TypeNew )
        {
            Wlc_Obj_t * pObj = Wlc_NtkObj( p->pNtk, iObj );
            Wlc_ObjUpdateType( p->pNtk, pObj, TypeNew );
            Wlc_ObjAddFanins( p->pNtk, pObj, p->vFanins );
            pObj->fXConst = XValue;
        }
        break;
    }
    return 1;
}